

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_agent_core_stats.cpp
# Opt level: O0

void __thiscall
so_5::stats::impl::ds_agent_core_stats_t::distribute
          (ds_agent_core_stats_t *this,mbox_t *distribution_mbox)

{
  size_t sVar1;
  suffix_t local_118;
  prefix_t local_110;
  suffix_t local_e0;
  prefix_t local_d8;
  suffix_t local_a8;
  prefix_t local_a0;
  suffix_t local_70;
  prefix_t local_68;
  unsigned_long local_38;
  coop_repository_stats_t stats;
  mbox_t *distribution_mbox_local;
  ds_agent_core_stats_t *this_local;
  
  stats.m_final_dereg_coop_count = (size_t)distribution_mbox;
  (*this->m_what->_vptr_environment_infrastructure_t[0xd])(&local_38);
  sVar1 = stats.m_final_dereg_coop_count;
  prefixes::coop_repository();
  local_70 = suffixes::coop_reg_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)sVar1,&local_68,&local_70,&local_38);
  sVar1 = stats.m_final_dereg_coop_count;
  prefixes::coop_repository();
  local_a8 = suffixes::coop_dereg_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)sVar1,&local_a0,&local_a8,
             &stats.m_registered_coop_count);
  sVar1 = stats.m_final_dereg_coop_count;
  prefixes::coop_repository();
  local_e0 = suffixes::agent_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)sVar1,&local_d8,&local_e0,
             &stats.m_deregistered_coop_count);
  sVar1 = stats.m_final_dereg_coop_count;
  prefixes::coop_repository();
  local_118 = suffixes::coop_final_dereg_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            ((intrusive_ptr_t<so_5::abstract_message_box_t> *)sVar1,&local_110,&local_118,
             &stats.m_total_agent_count);
  return;
}

Assistant:

void
ds_agent_core_stats_t::distribute(
	const mbox_t & distribution_mbox )
	{
		auto stats = m_what.query_coop_repository_stats();

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::coop_reg_count(),
				stats.m_registered_coop_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::coop_dereg_count(),
				stats.m_deregistered_coop_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::agent_count(),
				stats.m_total_agent_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::coop_repository(),
				suffixes::coop_final_dereg_count(),
				stats.m_final_dereg_coop_count );
	}